

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLMatrix33.cpp
# Opt level: O2

Matrix33 * __thiscall AML::Matrix33::operator+=(Matrix33 *this,Matrix33 *rhs)

{
  (this->field_0).data[0][0] = (rhs->field_0).data[0][0] + (this->field_0).data[0][0];
  (this->field_0).data[0][1] = (rhs->field_0).data[0][1] + (this->field_0).data[0][1];
  (this->field_0).data[0][2] = (rhs->field_0).data[0][2] + (this->field_0).data[0][2];
  (this->field_0).data[1][0] = (rhs->field_0).data[1][0] + (this->field_0).data[1][0];
  (this->field_0).data[1][1] = (rhs->field_0).data[1][1] + (this->field_0).data[1][1];
  (this->field_0).data[1][2] = (rhs->field_0).data[1][2] + (this->field_0).data[1][2];
  (this->field_0).data[2][0] = (rhs->field_0).data[2][0] + (this->field_0).data[2][0];
  (this->field_0).data[2][1] = (rhs->field_0).data[2][1] + (this->field_0).data[2][1];
  (this->field_0).data[2][2] = (rhs->field_0).data[2][2] + (this->field_0).data[2][2];
  return this;
}

Assistant:

Matrix33& Matrix33::operator+=(const Matrix33& rhs)
    {
        m11 += rhs.m11;
        m12 += rhs.m12;
        m13 += rhs.m13;
        m21 += rhs.m21;
        m22 += rhs.m22;
        m23 += rhs.m23;
        m31 += rhs.m31;
        m32 += rhs.m32;
        m33 += rhs.m33;
        return *this;
    }